

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O3

int XLearnSetPreModel(XL *out,char *pre_model_path)

{
  XL pvVar1;
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  pvVar1 = *out;
  std::__cxx11::string::string((string *)local_30,pre_model_path,&local_31);
  std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x160),(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetPreModel(XL *out, const char *pre_model_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().pre_model_file = std::string(pre_model_path);
  API_END();
}